

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

uint32_t __thiscall rcg::Buffer::getNumberOfParts(Buffer *this)

{
  PDSGetNumBufferParts p_Var1;
  uint in_EAX;
  void *pvVar2;
  unsigned_long uVar3;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  if (this->multipart == true) {
    p_Var1 = ((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->DSGetNumBufferParts;
    pvVar2 = Stream::getHandle(this->parent);
    (*p_Var1)(pvVar2,this->buffer,(uint32_t *)((long)&uStack_18 + 4));
  }
  else {
    pvVar2 = Stream::getHandle(this->parent);
    uVar3 = anon_unknown_6::getBufferValue<unsigned_long>(&this->gentl,pvVar2,this->buffer,0x13);
    uStack_18._4_4_ = (uint)(uVar3 != 8);
  }
  return uStack_18._4_4_;
}

Assistant:

uint32_t Buffer::getNumberOfParts() const
{
  uint32_t ret=0;

  if (multipart)
  {
    gentl->DSGetNumBufferParts(parent->getHandle(), buffer, &ret);
  }
  else
  {
    size_t type=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                       GenTL::BUFFER_INFO_PAYLOADTYPE);

    if (type != PAYLOAD_TYPE_CHUNK_ONLY)
    {
      ret=1;
    }
  }

  return ret;
}